

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRoundItem.h
# Opt level: O0

void __thiscall
TimeRoundItem<channel>::TimeRoundItem
          (TimeRoundItem<channel> *this,int _time_threod,Fun *_fun,shared_ptr<channel> *_ptr)

{
  shared_ptr<channel> *_ptr_local;
  Fun *_fun_local;
  int _time_threod_local;
  TimeRoundItem<channel> *this_local;
  
  this->time_threod = _time_threod;
  std::function<void_()>::function(&this->fun,_fun);
  std::shared_ptr<channel>::shared_ptr(&this->ptr,_ptr);
  this->index = 0;
  return;
}

Assistant:

TimeRoundItem(int _time_threod,Fun _fun,std::shared_ptr<T> _ptr):
        time_threod(_time_threod),fun(_fun),ptr(_ptr)
        {
            index = 0;
        }